

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexture.cpp
# Opt level: O2

void __thiscall
tcu::PixelBufferAccess::setPixel(PixelBufferAccess *this,IVec4 *color,int x,int y,int z)

{
  ChannelType type;
  undefined1 uVar1;
  undefined1 uVar2;
  uint uVar3;
  uint uVar4;
  TextureSwizzle *pTVar5;
  ushort uVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  ChannelOrder order;
  uint *dst;
  ulong uVar10;
  IVec4 swizzled;
  
  dst = (uint *)((long)(this->super_ConstPixelBufferAccess).m_data +
                (long)(z * (this->super_ConstPixelBufferAccess).m_pitch.m_data[2]) +
                (long)(y * (this->super_ConstPixelBufferAccess).m_pitch.m_data[1]) +
                (long)(x * (this->super_ConstPixelBufferAccess).m_pitch.m_data[0]));
  type = (this->super_ConstPixelBufferAccess).m_format.type;
  switch(type) {
  case UNORM_INT8:
    order = (this->super_ConstPixelBufferAccess).m_format.order;
    switch(order) {
    case RGB:
    case sRGB:
      iVar8 = color->m_data[0];
      if (0xfe < iVar8) {
        iVar8 = 0xff;
      }
      uVar1 = 0;
      uVar2 = (char)iVar8;
      if (iVar8 < 1) {
        uVar2 = uVar1;
      }
      *(undefined1 *)dst = uVar2;
      iVar8 = color->m_data[1];
      if (0xfe < iVar8) {
        iVar8 = 0xff;
      }
      uVar2 = (char)iVar8;
      if (iVar8 < 1) {
        uVar2 = uVar1;
      }
      *(undefined1 *)((long)dst + 1) = uVar2;
      iVar8 = 0xff;
      if (color->m_data[2] < 0xff) {
        iVar8 = color->m_data[2];
      }
      uVar2 = (char)iVar8;
      if (iVar8 < 1) {
        uVar2 = uVar1;
      }
      *(undefined1 *)((long)dst + 2) = uVar2;
      break;
    case RGBA:
    case sRGBA:
      iVar8 = color->m_data[0];
      if (0xfe < color->m_data[0]) {
        iVar8 = 0xff;
      }
      uVar1 = 0;
      uVar2 = (char)iVar8;
      if (iVar8 < 1) {
        uVar2 = uVar1;
      }
      *(undefined1 *)dst = uVar2;
      iVar8 = color->m_data[1];
      if (0xfe < iVar8) {
        iVar8 = 0xff;
      }
      uVar2 = (char)iVar8;
      if (iVar8 < 1) {
        uVar2 = uVar1;
      }
      *(undefined1 *)((long)dst + 1) = uVar2;
      iVar8 = color->m_data[2];
      if (0xfe < iVar8) {
        iVar8 = 0xff;
      }
      uVar2 = (char)iVar8;
      if (iVar8 < 1) {
        uVar2 = uVar1;
      }
      *(undefined1 *)((long)dst + 2) = uVar2;
      iVar8 = 0xff;
      if (color->m_data[3] < 0xff) {
        iVar8 = color->m_data[3];
      }
      uVar2 = (char)iVar8;
      if (iVar8 < 1) {
        uVar2 = uVar1;
      }
      *(undefined1 *)((long)dst + 3) = uVar2;
      break;
    default:
      goto switchD_00925acb_caseD_9;
    }
    break;
  default:
    order = (this->super_ConstPixelBufferAccess).m_format.order;
switchD_00925acb_caseD_9:
    uVar3 = getNumUsedChannels(order);
    pTVar5 = getChannelWriteSwizzle(order);
    uVar4 = getChannelSize(type);
    for (uVar10 = 0; uVar3 != uVar10; uVar10 = uVar10 + 1) {
      anon_unknown_74::intToChannel
                ((deUint8 *)dst,color->m_data[(int)pTVar5->components[uVar10]],
                 (this->super_ConstPixelBufferAccess).m_format.type);
      dst = (uint *)((long)dst + (ulong)uVar4);
    }
    break;
  case UNORM_BYTE_44:
  case UNSIGNED_BYTE_44:
    uVar3 = color->m_data[0];
    if (0xe < (uint)color->m_data[0]) {
      uVar3 = 0xf;
    }
    uVar4 = 0xf;
    if ((uint)color->m_data[1] < 0xf) {
      uVar4 = color->m_data[1];
    }
    *(byte *)dst = (byte)uVar4 | (byte)(uVar3 << 4);
    break;
  case UNORM_SHORT_565:
  case UNSIGNED_SHORT_565:
    swizzleRB<int>((tcu *)&swizzled,color,RGB,(this->super_ConstPixelBufferAccess).m_format.order);
    if (0x1e < (uint)swizzled.m_data[0]) {
      swizzled.m_data[0] = 0x1f;
    }
    iVar8 = 0x3f;
    if ((uint)swizzled.m_data[1] < 0x3f) {
      iVar8 = swizzled.m_data[1];
    }
    iVar7 = 0x1f;
    if ((uint)swizzled.m_data[2] < 0x1f) {
      iVar7 = swizzled.m_data[2];
    }
    uVar6 = (ushort)iVar7 | (ushort)(iVar8 << 5) | (ushort)(swizzled.m_data[0] << 0xb);
    goto LAB_00925a9e;
  case UNORM_SHORT_555:
    swizzleRB<int>((tcu *)&swizzled,color,RGB,(this->super_ConstPixelBufferAccess).m_format.order);
    if (0x1e < (uint)swizzled.m_data[0]) {
      swizzled.m_data[0] = 0x1f;
    }
    if (0x1e < (uint)swizzled.m_data[1]) {
      swizzled.m_data[1] = 0x1f;
    }
    uVar6 = (ushort)(swizzled.m_data[1] << 5) | (ushort)(swizzled.m_data[0] << 10);
    uVar3 = 0x1f;
    if ((uint)swizzled.m_data[2] < 0x1f) {
      uVar3 = swizzled.m_data[2];
    }
    goto LAB_00925a9c;
  case UNORM_SHORT_4444:
  case UNSIGNED_SHORT_4444:
    swizzleRB<int>((tcu *)&swizzled,color,RGBA,(this->super_ConstPixelBufferAccess).m_format.order);
    if (0xe < (uint)swizzled.m_data[0]) {
      swizzled.m_data[0] = 0xf;
    }
    if (0xe < (uint)swizzled.m_data[1]) {
      swizzled.m_data[1] = 0xf;
    }
    uVar6 = (ushort)(swizzled.m_data[1] << 8) | (ushort)(swizzled.m_data[0] << 0xc);
    if (0xe < (uint)swizzled.m_data[2]) {
      swizzled.m_data[2] = 0xf;
    }
    uVar3 = 0xf;
    if ((uint)swizzled.m_data[3] < 0xf) {
      uVar3 = swizzled.m_data[3];
    }
    uVar3 = uVar3 | swizzled.m_data[2] << 4;
LAB_00925a9c:
    uVar6 = (ushort)uVar3 | uVar6;
LAB_00925a9e:
    *(ushort *)dst = uVar6;
    break;
  case UNORM_SHORT_5551:
  case UNSIGNED_SHORT_5551:
    swizzleRB<int>((tcu *)&swizzled,color,RGBA,(this->super_ConstPixelBufferAccess).m_format.order);
    if (0x1e < (uint)swizzled.m_data[0]) {
      swizzled.m_data[0] = 0x1f;
    }
    if (0x1e < (uint)swizzled.m_data[1]) {
      swizzled.m_data[1] = 0x1f;
    }
    iVar8 = 0x1f;
    if ((uint)swizzled.m_data[2] < 0x1f) {
      iVar8 = swizzled.m_data[2];
    }
    *(ushort *)dst =
         (ushort)(swizzled.m_data[3] != 0) |
         ((ushort)(swizzled.m_data[1] << 6) | (ushort)(swizzled.m_data[0] << 0xb)) +
         (short)iVar8 * 2;
    break;
  case UNORM_SHORT_1555:
    uVar3 = color->m_data[1];
    uVar4 = color->m_data[0];
    if (0x1e < (uint)color->m_data[0]) {
      uVar4 = 0x1f;
    }
    if (0x1e < uVar3) {
      uVar3 = 0x1f;
    }
    uVar9 = 0x1f;
    if ((uint)color->m_data[2] < 0x1f) {
      uVar9 = color->m_data[2];
    }
    *(ushort *)dst =
         (ushort)uVar9 | (ushort)(uVar3 << 5) |
         (ushort)(uVar4 << 10) | (ushort)(color->m_data[3] != 0) << 0xf;
    break;
  case UNORM_INT_101010:
    uVar3 = color->m_data[0];
    uVar4 = color->m_data[1];
    if (0x3fe < uVar3) {
      uVar3 = 0x3ff;
    }
    if (0x3fe < uVar4) {
      uVar4 = 0x3ff;
    }
    uVar9 = 0x3ff;
    if ((uint)color->m_data[2] < 0x3ff) {
      uVar9 = color->m_data[2];
    }
    *dst = (uVar4 << 0xc | uVar3 << 0x16) + uVar9 * 4;
    break;
  case SNORM_INT_1010102_REV:
  case SIGNED_INT_1010102_REV:
    swizzleRB<int>((tcu *)&swizzled,color,RGBA,(this->super_ConstPixelBufferAccess).m_format.order);
    if (0x1fe < swizzled.m_data[0]) {
      swizzled.m_data[0] = 0x1ff;
    }
    if (swizzled.m_data[0] < -0x1ff) {
      swizzled.m_data[0] = 0xfffffe00;
    }
    if (0x1fe < swizzled.m_data[1]) {
      swizzled.m_data[1] = 0x1ff;
    }
    if (swizzled.m_data[1] < -0x1ff) {
      swizzled.m_data[1] = 0xfffffe00;
    }
    uVar3 = 0x1ff;
    if (swizzled.m_data[2] < 0x1ff) {
      uVar3 = swizzled.m_data[2];
    }
    if ((int)uVar3 < -0x1ff) {
      uVar3 = 0xfffffe00;
    }
    iVar8 = 1;
    if (swizzled.m_data[3] < 1) {
      iVar8 = swizzled.m_data[3];
    }
    iVar7 = -2;
    if (-2 < iVar8) {
      iVar7 = iVar8;
    }
    *dst = iVar7 << 0x1e |
           (uVar3 & 0x3ff) << 0x14 |
           (swizzled.m_data[1] & 0x3ffU) << 10 | swizzled.m_data[0] & 0x3ffU;
    break;
  case UNORM_INT_1010102_REV:
  case UNSIGNED_INT_1010102_REV:
    swizzleRB<int>((tcu *)&swizzled,color,RGBA,(this->super_ConstPixelBufferAccess).m_format.order);
    if (0x3fe < (uint)swizzled.m_data[0]) {
      swizzled.m_data[0] = 0x3ff;
    }
    if (0x3fe < (uint)swizzled.m_data[1]) {
      swizzled.m_data[1] = 0x3ff;
    }
    iVar8 = 0x3ff;
    if ((uint)swizzled.m_data[2] < 0x3ff) {
      iVar8 = swizzled.m_data[2];
    }
    iVar7 = 3;
    if ((uint)swizzled.m_data[3] < 3) {
      iVar7 = swizzled.m_data[3];
    }
    *dst = iVar7 << 0x1e | iVar8 << 0x14 | swizzled.m_data[1] << 10 | swizzled.m_data[0];
  }
  return;
}

Assistant:

void PixelBufferAccess::setPixel (const IVec4& color, int x, int y, int z) const
{
	DE_ASSERT(de::inBounds(x, 0, getWidth()));
	DE_ASSERT(de::inBounds(y, 0, getHeight()));
	DE_ASSERT(de::inBounds(z, 0, getDepth()));
	DE_ASSERT(!isCombinedDepthStencilType(m_format.type)); // combined types cannot be accessed directly
	DE_ASSERT(m_format.order != TextureFormat::DS); // combined formats cannot be accessed directly

	deUint8* const pixelPtr = (deUint8*)getPixelPtr(x, y, z);

	// Optimized fomats.
	if (m_format.type == TextureFormat::UNORM_INT8)
	{
		if (m_format.order == TextureFormat::RGBA || m_format.order == TextureFormat::sRGBA)
		{
			writeRGBA8888Int(pixelPtr, color);
			return;
		}
		else if (m_format.order == TextureFormat::RGB || m_format.order == TextureFormat::sRGB)
		{
			writeRGB888Int(pixelPtr, color);
			return;
		}
	}

#define PU(VAL, OFFS, BITS)		(uintToChannel((deUint32)(VAL), (BITS)) << (OFFS))
#define PI(VAL, OFFS, BITS)		(intToChannel((deUint32)(VAL), (BITS)) << (OFFS))

	switch (m_format.type)
	{
		case TextureFormat::UNSIGNED_BYTE_44:	// Fall-through
		case TextureFormat::UNORM_BYTE_44:		*((deUint8 *)pixelPtr) = (deUint8 )(PU(color[0],  4, 4) | PU(color[1], 0, 4));				break;
		case TextureFormat::UNORM_INT_101010:	*((deUint32*)pixelPtr) = PU(color[0], 22, 10) | PU(color[1], 12, 10) | PU(color[2], 2, 10);	break;

		case TextureFormat::UNORM_SHORT_565:
		case TextureFormat::UNSIGNED_SHORT_565:
		{
			const IVec4 swizzled = swizzleRB(color, TextureFormat::RGB, m_format.order);
			*((deUint16*)pixelPtr) = (deUint16)(PU(swizzled[0], 11, 5) | PU(swizzled[1], 5, 6) | PU(swizzled[2], 0, 5));
			break;
		}

		case TextureFormat::UNORM_SHORT_555:
		{
			const IVec4 swizzled = swizzleRB(color, TextureFormat::RGB, m_format.order);
			*((deUint16*)pixelPtr) = (deUint16)(PU(swizzled[0], 10, 5) | PU(swizzled[1], 5, 5) | PU(swizzled[2], 0, 5));
			break;
		}

		case TextureFormat::UNORM_SHORT_4444:
		case TextureFormat::UNSIGNED_SHORT_4444:
		{
			const IVec4 swizzled = swizzleRB(color, TextureFormat::RGBA, m_format.order);
			*((deUint16*)pixelPtr) = (deUint16)(PU(swizzled[0], 12, 4) | PU(swizzled[1], 8, 4) | PU(swizzled[2], 4, 4) | PU(swizzled[3], 0, 4));
			break;
		}

		case TextureFormat::UNORM_SHORT_5551:
		case TextureFormat::UNSIGNED_SHORT_5551:
		{
			const IVec4 swizzled = swizzleRB(color, TextureFormat::RGBA, m_format.order);
			*((deUint16*)pixelPtr) = (deUint16)(PU(swizzled[0], 11, 5) | PU(swizzled[1], 6, 5) | PU(swizzled[2], 1, 5) | PU(swizzled[3], 0, 1));
			break;
		}

		case TextureFormat::UNORM_SHORT_1555:
		{
			const IVec4 swizzled = color.swizzle(3,0,1,2); // RGBA -> ARGB
			*((deUint16*)pixelPtr) = (deUint16)(PU(swizzled[0], 15, 1) | PU(swizzled[1], 10, 5) | PU(swizzled[2], 5, 5) | PU(swizzled[3], 0, 5));
			break;
		}

		case TextureFormat::UNORM_INT_1010102_REV:
		case TextureFormat::UNSIGNED_INT_1010102_REV:
		{
			const IVec4 swizzled = swizzleRB(color, TextureFormat::RGBA, m_format.order);
			*((deUint32*)pixelPtr) = PU(swizzled[0],  0, 10) | PU(swizzled[1], 10, 10) | PU(swizzled[2], 20, 10) | PU(swizzled[3], 30, 2);
			break;
		}

		case TextureFormat::SNORM_INT_1010102_REV:
		case TextureFormat::SIGNED_INT_1010102_REV:
		{
			const IVec4 swizzled = swizzleRB(color, TextureFormat::RGBA, m_format.order);
			*((deUint32*)pixelPtr) = PI(swizzled[0],  0, 10) | PI(swizzled[1], 10, 10) | PI(swizzled[2], 20, 10) | PI(swizzled[3], 30, 2);
			break;
		}

		default:
		{
			// Generic path.
			int								numChannels	= getNumUsedChannels(m_format.order);
			const TextureSwizzle::Channel*	map			= getChannelWriteSwizzle(m_format.order).components;
			int								channelSize	= getChannelSize(m_format.type);

			for (int c = 0; c < numChannels; c++)
			{
				DE_ASSERT(deInRange32(map[c], TextureSwizzle::CHANNEL_0, TextureSwizzle::CHANNEL_3));
				intToChannel(pixelPtr + channelSize*c, color[map[c]], m_format.type);
			}
			break;
		}
	}

#undef PU
#undef PI
}